

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansi_display_driver.cpp
# Opt level: O2

void __thiscall AnsiDisplayDriver::display(AnsiDisplayDriver *this,Document *doc,ostream *output)

{
  undefined4 uVar1;
  ulong uVar2;
  long *plVar3;
  ulong uVar4;
  long *plVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  AnsiWrapper wrapper;
  undefined4 local_50 [8];
  
  AnsiWrapper::AnsiWrapper(&wrapper,output);
  uVar8 = 0;
  do {
    uVar2 = Document::size();
    if (uVar2 <= uVar8) {
      return;
    }
    plVar3 = (long *)Document::operator[]((ulong)doc);
    uVar1 = (**(code **)(*plVar3 + 8))(plVar3);
    switch(uVar1) {
    case 1:
      local_50[0] = 4;
      AnsiWrapper::fg((Color *)&wrapper);
      AnsiWrapper::underline(SUB81(&wrapper,0));
      break;
    case 2:
      pcVar7 = "  ";
      goto LAB_0012bf29;
    case 3:
      pcVar7 = "    ";
LAB_0012bf29:
      std::operator<<(_wrapper,pcVar7);
      local_50[0] = 4;
      AnsiWrapper::fg((Color *)&wrapper);
      break;
    default:
      std::operator<<(_wrapper,"    ");
      break;
    case 8:
      pcVar7 = "    ";
      goto LAB_0012bf5b;
    case 9:
      pcVar7 = "      ";
LAB_0012bf5b:
      std::operator<<(_wrapper,pcVar7);
      local_50[0] = 6;
      AnsiWrapper::fg((Color *)&wrapper);
      std::operator<<(_wrapper,"* ");
      AnsiWrapper::reset();
      break;
    case 10:
      std::operator<<(_wrapper,"    ");
      local_50[0] = 4;
      AnsiWrapper::fg((Color *)&wrapper);
      AnsiWrapper::reverse();
    }
    for (uVar2 = 0; uVar4 = Paragraph::size(), uVar2 < uVar4; uVar2 = uVar2 + 1) {
      plVar5 = (long *)Paragraph::operator[]((ulong)plVar3);
      if ((plVar5 != (long *)0x0) &&
         (lVar6 = __dynamic_cast(plVar5,&LineElement::typeinfo,&CodeLineElement::typeinfo,0),
         lVar6 != 0)) {
        AnsiWrapper::reverse();
      }
      (**(code **)(*plVar5 + 0x10))((string *)local_50,plVar5);
      std::operator<<(_wrapper,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
      AnsiWrapper::reset();
    }
    AnsiWrapper::reset();
    AnsiWrapper::operator<<(&wrapper,std::endl<char,std::char_traits<char>>);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void AnsiDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p(nullptr);
	LineElement *l(nullptr);
	CodeLineElement *code_le(nullptr);

	AnsiWrapper wrapper(output);

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];
		switch (p->level()) {
			case Paragraph::Level::Title1:
				wrapper.fg(Color::Blue);
				wrapper.underline();
				break;
			case Paragraph::Level::Title2:
				wrapper << "  ";
				wrapper.fg(Color::Blue);
				break;
			case Paragraph::Level::Title3:
				wrapper << "    ";
				wrapper.fg(Color::Blue);
				break;
			case Paragraph::Level::Quote:
				wrapper << "    ";
				wrapper.fg(Color::Blue);
				wrapper.reverse();
				break;
			case Paragraph::Level::UList1:
				wrapper << "    ";
				wrapper.fg(Color::Cyan);
				wrapper << "* ";
				wrapper.reset();
				break;
			case Paragraph::Level::UList2:
				wrapper << "      ";
				wrapper.fg(Color::Cyan);
				wrapper << "* ";
				wrapper.reset();
				break;
			default:
				wrapper << "    ";
				break;

		}
		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];
			code_le = dynamic_cast<CodeLineElement*>(l);

			if (code_le) {
				wrapper.reverse();
			}

			wrapper << l->content();
			
			wrapper.reset();

		}
		wrapper.reset();
		wrapper << endl;
	}
}